

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

char * booster::locale::details::string_cast_traits<char>::cast(char *msg,string *buffer)

{
  byte bVar1;
  bool bVar2;
  
  bVar2 = is_us_ascii_string(msg);
  if (!bVar2) {
    strlen(msg);
    std::__cxx11::string::reserve((ulong)buffer);
    while (bVar1 = *msg, bVar1 != 0) {
      msg = (char *)((byte *)msg + 1);
      if (bVar1 < 0x7f) {
        std::__cxx11::string::push_back((char)buffer);
      }
    }
    msg = (buffer->_M_dataplus)._M_p;
  }
  return msg;
}

Assistant:

static char const *cast(char const *msg,std::string &buffer)
                {
                    if(is_us_ascii_string(msg))
                        return msg;
                    buffer.reserve(strlen(msg));
                    char c;
                    while((c=*msg++)!=0) {
                        if(is_us_ascii_char(c))
                            buffer+=c;
                    }
                    return buffer.c_str();
                }